

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O2

void luaL_checkversion_(lua_State *L,lua_Number ver,size_t sz)

{
  lua_Number lVar1;
  
  lVar1 = lua_version(L);
  if (sz != 0x88) {
    luaL_error(L,"core and library have incompatible numeric types");
    return;
  }
  if ((lVar1 == ver) && (!NAN(lVar1) && !NAN(ver))) {
    return;
  }
  luaL_error(L,"version mismatch: app. needs %f, Lua core provides %f");
  return;
}

Assistant:

LUALIB_API void luaL_checkversion_ (lua_State *L, lua_Number ver, size_t sz) {
  lua_Number v = lua_version(L);
  if (sz != LUAL_NUMSIZES)  /* check numeric types */
    luaL_error(L, "core and library have incompatible numeric types");
  else if (v != ver)
    luaL_error(L, "version mismatch: app. needs %f, Lua core provides %f",
                  (LUAI_UACNUMBER)ver, (LUAI_UACNUMBER)v);
}